

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType::~IfcFlowTreatmentDeviceType
          (IfcFlowTreatmentDeviceType *this)

{
  IfcElementType::~IfcElementType((IfcElementType *)this,&PTR_construction_vtable_24__007a5200);
  return;
}

Assistant:

IfcFlowTreatmentDeviceType() : Object("IfcFlowTreatmentDeviceType") {}